

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

void ss_mintrosort(sauchar_t *T,saidx_t *PA,saidx_t *first,saidx_t *last,saidx_t depth)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  saint_t sVar4;
  long lVar5;
  saidx_t *psVar6;
  int iVar7;
  int iVar8;
  int *in_RCX;
  int *in_RDX;
  saidx_t *in_RSI;
  long in_RDI;
  int in_R8D;
  bool bVar9;
  saint_t x;
  saint_t v;
  saint_t limit;
  saint_t ssize;
  saidx_t t;
  saidx_t s;
  saidx_t *f;
  saidx_t *e;
  saidx_t *d;
  saidx_t *c;
  saidx_t *b;
  saidx_t *a;
  sauchar_t *Td;
  anon_struct_24_4_d8a55aef stack [16];
  int *local_208;
  saidx_t depth_00;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int *in_stack_fffffffffffffe20;
  int *piVar10;
  int *in_stack_fffffffffffffe28;
  int *piVar11;
  int *in_stack_fffffffffffffe30;
  int *in_stack_fffffffffffffe38;
  int *in_stack_fffffffffffffe40;
  saidx_t *local_1b8;
  undefined8 local_1a8 [2];
  int aiStack_198 [93];
  int local_24;
  int *local_20;
  int *local_18;
  saidx_t *local_10;
  long local_8;
  
  bVar1 = 0;
  depth_00 = 0;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar3 = ss_ilg((saidx_t)((long)in_RCX - (long)in_RDX >> 2));
  do {
    while( true ) {
      while ((long)local_20 - (long)local_18 >> 2 < 9) {
        if (1 < (long)local_20 - (long)local_18 >> 2) {
          ss_insertionsort((sauchar_t *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                           in_stack_fffffffffffffe20,
                           (saidx_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                           depth_00);
        }
        if (depth_00 == 0) {
          return;
        }
        depth_00 = depth_00 + -1;
        local_18 = (int *)local_1a8[(long)depth_00 * 3];
        local_20 = (int *)local_1a8[(long)depth_00 * 3 + 1];
        local_24 = aiStack_198[(long)depth_00 * 6];
        iVar3 = aiStack_198[(long)depth_00 * 6 + 1];
      }
      lVar5 = local_8 + local_24;
      iVar7 = iVar3 + -1;
      bVar9 = iVar3 == 0;
      iVar3 = iVar7;
      if (bVar9) {
        ss_heapsort((sauchar_t *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                    in_stack_fffffffffffffe30,(saidx_t)((ulong)in_stack_fffffffffffffe28 >> 0x20));
        iVar3 = iVar7;
      }
      if (iVar3 < 0) break;
      psVar6 = ss_pivot((sauchar_t *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                        (saidx_t *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                        (saidx_t *)CONCAT44(depth_00,iVar3));
      bVar2 = *(byte *)(lVar5 + local_10[*psVar6]);
      in_stack_fffffffffffffe18 = *local_18;
      *local_18 = *psVar6;
      *psVar6 = in_stack_fffffffffffffe18;
      in_stack_fffffffffffffe40 = local_18;
      do {
        in_stack_fffffffffffffe40 = in_stack_fffffffffffffe40 + 1;
        bVar9 = false;
        if (in_stack_fffffffffffffe40 < local_20) {
          bVar1 = *(byte *)(lVar5 + local_10[*in_stack_fffffffffffffe40]);
          bVar9 = bVar1 == bVar2;
        }
      } while (bVar9);
      in_stack_fffffffffffffe30 = local_20;
      local_1b8 = in_stack_fffffffffffffe40;
      if ((in_stack_fffffffffffffe40 < local_20) && (bVar1 < bVar2)) {
        while( true ) {
          in_stack_fffffffffffffe40 = in_stack_fffffffffffffe40 + 1;
          bVar9 = false;
          if (in_stack_fffffffffffffe40 < local_20) {
            bVar1 = *(byte *)(lVar5 + local_10[*in_stack_fffffffffffffe40]);
            bVar9 = bVar1 <= bVar2;
          }
          if (!bVar9) break;
          if (bVar1 == bVar2) {
            in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe40;
            *in_stack_fffffffffffffe40 = *local_1b8;
            *local_1b8 = in_stack_fffffffffffffe18;
            local_1b8 = local_1b8 + 1;
          }
        }
      }
      do {
        in_stack_fffffffffffffe30 = in_stack_fffffffffffffe30 + -1;
        bVar9 = false;
        if (in_stack_fffffffffffffe40 < in_stack_fffffffffffffe30) {
          bVar1 = *(byte *)(lVar5 + local_10[*in_stack_fffffffffffffe30]);
          bVar9 = bVar1 == bVar2;
        }
      } while (bVar9);
      in_stack_fffffffffffffe38 = in_stack_fffffffffffffe30;
      if ((in_stack_fffffffffffffe40 < in_stack_fffffffffffffe30) && (bVar2 < bVar1)) {
        while( true ) {
          in_stack_fffffffffffffe38 = in_stack_fffffffffffffe38 + -1;
          bVar9 = false;
          if (in_stack_fffffffffffffe40 < in_stack_fffffffffffffe38) {
            bVar1 = *(byte *)(lVar5 + local_10[*in_stack_fffffffffffffe38]);
            bVar9 = bVar2 <= bVar1;
          }
          if (!bVar9) break;
          if (bVar1 == bVar2) {
            in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe38;
            *in_stack_fffffffffffffe38 = *in_stack_fffffffffffffe30;
            *in_stack_fffffffffffffe30 = in_stack_fffffffffffffe18;
            in_stack_fffffffffffffe30 = in_stack_fffffffffffffe30 + -1;
          }
        }
      }
      while (in_stack_fffffffffffffe40 < in_stack_fffffffffffffe38) {
        in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe40;
        *in_stack_fffffffffffffe40 = *in_stack_fffffffffffffe38;
        *in_stack_fffffffffffffe38 = in_stack_fffffffffffffe18;
        while( true ) {
          in_stack_fffffffffffffe40 = in_stack_fffffffffffffe40 + 1;
          bVar9 = false;
          if (in_stack_fffffffffffffe40 < in_stack_fffffffffffffe38) {
            bVar1 = *(byte *)(lVar5 + local_10[*in_stack_fffffffffffffe40]);
            bVar9 = bVar1 <= bVar2;
          }
          if (!bVar9) break;
          if (bVar1 == bVar2) {
            in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe40;
            *in_stack_fffffffffffffe40 = *local_1b8;
            *local_1b8 = in_stack_fffffffffffffe18;
            local_1b8 = local_1b8 + 1;
          }
        }
        while( true ) {
          in_stack_fffffffffffffe38 = in_stack_fffffffffffffe38 + -1;
          bVar9 = false;
          if (in_stack_fffffffffffffe40 < in_stack_fffffffffffffe38) {
            bVar1 = *(byte *)(lVar5 + local_10[*in_stack_fffffffffffffe38]);
            bVar9 = bVar2 <= bVar1;
          }
          if (!bVar9) break;
          if (bVar1 == bVar2) {
            in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe38;
            *in_stack_fffffffffffffe38 = *in_stack_fffffffffffffe30;
            *in_stack_fffffffffffffe30 = in_stack_fffffffffffffe18;
            in_stack_fffffffffffffe30 = in_stack_fffffffffffffe30 + -1;
          }
        }
      }
      if (in_stack_fffffffffffffe30 < local_1b8) {
        iVar3 = iVar3 + 1;
        if (*(byte *)(lVar5 + (local_10[*local_18] + -1)) < bVar2) {
          local_18 = ss_partition(local_10,local_18,local_20,local_24);
          iVar3 = ss_ilg((saidx_t)((long)local_20 - (long)local_18 >> 2));
        }
        local_24 = local_24 + 1;
      }
      else {
        iVar7 = (int)((long)local_1b8 - (long)local_18 >> 2);
        iVar8 = (int)((long)in_stack_fffffffffffffe40 - (long)local_1b8 >> 2);
        if (iVar8 < iVar7) {
          iVar7 = iVar8;
        }
        piVar10 = in_stack_fffffffffffffe40 + -(long)iVar7;
        piVar11 = local_18;
        for (; 0 < iVar7; iVar7 = iVar7 + -1) {
          iVar8 = *piVar11;
          *piVar11 = *piVar10;
          *piVar10 = iVar8;
          piVar11 = piVar11 + 1;
          piVar10 = piVar10 + 1;
        }
        in_stack_fffffffffffffe1c =
             (int)((long)in_stack_fffffffffffffe30 - (long)(in_stack_fffffffffffffe40 + -1) >> 2);
        in_stack_fffffffffffffe18 =
             (int)((long)local_20 - (long)in_stack_fffffffffffffe30 >> 2) + -1;
        if (in_stack_fffffffffffffe18 < in_stack_fffffffffffffe1c) {
          in_stack_fffffffffffffe1c = in_stack_fffffffffffffe18;
        }
        in_stack_fffffffffffffe20 = local_20 + -(long)in_stack_fffffffffffffe1c;
        in_stack_fffffffffffffe28 = in_stack_fffffffffffffe40;
        for (; 0 < in_stack_fffffffffffffe1c;
            in_stack_fffffffffffffe1c = in_stack_fffffffffffffe1c + -1) {
          in_stack_fffffffffffffe18 = *in_stack_fffffffffffffe28;
          *in_stack_fffffffffffffe28 = *in_stack_fffffffffffffe20;
          *in_stack_fffffffffffffe20 = in_stack_fffffffffffffe18;
          in_stack_fffffffffffffe28 = in_stack_fffffffffffffe28 + 1;
          in_stack_fffffffffffffe20 = in_stack_fffffffffffffe20 + 1;
        }
        psVar6 = local_18 + ((long)in_stack_fffffffffffffe40 - (long)local_1b8 >> 2);
        in_stack_fffffffffffffe38 =
             local_20 +
             -((long)in_stack_fffffffffffffe30 - (long)(in_stack_fffffffffffffe40 + -1) >> 2);
        local_208 = psVar6;
        if (*(byte *)(lVar5 + (local_10[*psVar6] + -1)) < bVar2) {
          local_208 = ss_partition(local_10,psVar6,in_stack_fffffffffffffe38,local_24);
        }
        if ((long)local_20 - (long)in_stack_fffffffffffffe38 >> 2 <
            (long)psVar6 - (long)local_18 >> 2) {
          if ((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2 <
              (long)psVar6 - (long)local_18 >> 2) {
            if ((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2 <
                (long)local_20 - (long)in_stack_fffffffffffffe38 >> 2) {
              local_1a8[(long)depth_00 * 3] = local_18;
              local_1a8[(long)depth_00 * 3 + 1] = psVar6;
              aiStack_198[(long)depth_00 * 6] = local_24;
              iVar7 = depth_00 + 1;
              aiStack_198[(long)depth_00 * 6 + 1] = iVar3;
              local_1a8[(long)iVar7 * 3] = in_stack_fffffffffffffe38;
              local_1a8[(long)iVar7 * 3 + 1] = local_20;
              aiStack_198[(long)iVar7 * 6] = local_24;
              depth_00 = depth_00 + 2;
              aiStack_198[(long)iVar7 * 6 + 1] = iVar3;
              local_18 = local_208;
              local_24 = local_24 + 1;
              local_20 = in_stack_fffffffffffffe38;
              iVar3 = ss_ilg((saidx_t)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
              in_stack_fffffffffffffe40 = local_208;
            }
            else {
              local_1a8[(long)depth_00 * 3] = local_18;
              local_1a8[(long)depth_00 * 3 + 1] = psVar6;
              aiStack_198[(long)depth_00 * 6] = local_24;
              iVar7 = depth_00 + 1;
              aiStack_198[(long)depth_00 * 6 + 1] = iVar3;
              local_1a8[(long)iVar7 * 3] = local_208;
              local_1a8[(long)iVar7 * 3 + 1] = in_stack_fffffffffffffe38;
              aiStack_198[(long)iVar7 * 6] = local_24 + 1;
              sVar4 = ss_ilg((saidx_t)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
              depth_00 = iVar7 + 1;
              aiStack_198[(long)iVar7 * 6 + 1] = sVar4;
              local_18 = in_stack_fffffffffffffe38;
              in_stack_fffffffffffffe40 = local_208;
            }
          }
          else {
            local_1a8[(long)depth_00 * 3] = local_208;
            local_1a8[(long)depth_00 * 3 + 1] = in_stack_fffffffffffffe38;
            aiStack_198[(long)depth_00 * 6] = local_24 + 1;
            sVar4 = ss_ilg((saidx_t)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
            iVar7 = depth_00 + 1;
            aiStack_198[(long)depth_00 * 6 + 1] = sVar4;
            local_1a8[(long)iVar7 * 3] = local_18;
            local_1a8[(long)iVar7 * 3 + 1] = psVar6;
            aiStack_198[(long)iVar7 * 6] = local_24;
            depth_00 = depth_00 + 2;
            aiStack_198[(long)iVar7 * 6 + 1] = iVar3;
            local_18 = in_stack_fffffffffffffe38;
            in_stack_fffffffffffffe40 = local_208;
          }
        }
        else if ((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2 <
                 (long)local_20 - (long)in_stack_fffffffffffffe38 >> 2) {
          if ((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2 <
              (long)psVar6 - (long)local_18 >> 2) {
            local_1a8[(long)depth_00 * 3] = in_stack_fffffffffffffe38;
            local_1a8[(long)depth_00 * 3 + 1] = local_20;
            aiStack_198[(long)depth_00 * 6] = local_24;
            iVar7 = depth_00 + 1;
            aiStack_198[(long)depth_00 * 6 + 1] = iVar3;
            local_1a8[(long)iVar7 * 3] = local_18;
            local_1a8[(long)iVar7 * 3 + 1] = psVar6;
            aiStack_198[(long)iVar7 * 6] = local_24;
            depth_00 = depth_00 + 2;
            aiStack_198[(long)iVar7 * 6 + 1] = iVar3;
            local_18 = local_208;
            local_24 = local_24 + 1;
            local_20 = in_stack_fffffffffffffe38;
            iVar3 = ss_ilg((saidx_t)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
            in_stack_fffffffffffffe40 = local_208;
          }
          else {
            local_1a8[(long)depth_00 * 3] = in_stack_fffffffffffffe38;
            local_1a8[(long)depth_00 * 3 + 1] = local_20;
            aiStack_198[(long)depth_00 * 6] = local_24;
            iVar7 = depth_00 + 1;
            aiStack_198[(long)depth_00 * 6 + 1] = iVar3;
            local_1a8[(long)iVar7 * 3] = local_208;
            local_1a8[(long)iVar7 * 3 + 1] = in_stack_fffffffffffffe38;
            aiStack_198[(long)iVar7 * 6] = local_24 + 1;
            sVar4 = ss_ilg((saidx_t)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
            depth_00 = iVar7 + 1;
            aiStack_198[(long)iVar7 * 6 + 1] = sVar4;
            local_20 = psVar6;
            in_stack_fffffffffffffe40 = local_208;
          }
        }
        else {
          local_1a8[(long)depth_00 * 3] = local_208;
          local_1a8[(long)depth_00 * 3 + 1] = in_stack_fffffffffffffe38;
          aiStack_198[(long)depth_00 * 6] = local_24 + 1;
          sVar4 = ss_ilg((saidx_t)((long)in_stack_fffffffffffffe38 - (long)local_208 >> 2));
          iVar7 = depth_00 + 1;
          aiStack_198[(long)depth_00 * 6 + 1] = sVar4;
          local_1a8[(long)iVar7 * 3] = in_stack_fffffffffffffe38;
          local_1a8[(long)iVar7 * 3 + 1] = local_20;
          aiStack_198[(long)iVar7 * 6] = local_24;
          depth_00 = depth_00 + 2;
          aiStack_198[(long)iVar7 * 6 + 1] = iVar3;
          local_20 = psVar6;
          in_stack_fffffffffffffe40 = local_208;
        }
      }
    }
    local_1b8 = local_18;
    bVar2 = *(byte *)(lVar5 + local_10[*local_18]);
    while (local_1b8 = local_1b8 + 1, local_1b8 < local_20) {
      bVar1 = *(byte *)(lVar5 + local_10[*local_1b8]);
      if (bVar1 != bVar2) {
        if (1 < (long)local_1b8 - (long)local_18 >> 2) break;
        local_18 = local_1b8;
        bVar2 = bVar1;
      }
    }
    if (*(byte *)(lVar5 + (local_10[*local_18] + -1)) < bVar2) {
      local_18 = ss_partition(local_10,local_18,local_1b8,local_24);
    }
    if ((long)local_20 - (long)local_1b8 >> 2 < (long)local_1b8 - (long)local_18 >> 2) {
      if ((long)local_20 - (long)local_1b8 >> 2 < 2) {
        local_20 = local_1b8;
        local_24 = local_24 + 1;
        iVar3 = ss_ilg((saidx_t)((long)local_1b8 - (long)local_18 >> 2));
      }
      else {
        local_1a8[(long)depth_00 * 3] = local_18;
        local_1a8[(long)depth_00 * 3 + 1] = local_1b8;
        aiStack_198[(long)depth_00 * 6] = local_24 + 1;
        sVar4 = ss_ilg((saidx_t)((long)local_1b8 - (long)local_18 >> 2));
        aiStack_198[(long)depth_00 * 6 + 1] = sVar4;
        local_18 = local_1b8;
        iVar3 = -1;
        depth_00 = depth_00 + 1;
      }
    }
    else if ((long)local_1b8 - (long)local_18 >> 2 < 2) {
      local_18 = local_1b8;
      iVar3 = -1;
    }
    else {
      local_1a8[(long)depth_00 * 3] = local_1b8;
      local_1a8[(long)depth_00 * 3 + 1] = local_20;
      aiStack_198[(long)depth_00 * 6] = local_24;
      iVar7 = depth_00 + 1;
      aiStack_198[(long)depth_00 * 6 + 1] = -1;
      local_20 = local_1b8;
      local_24 = local_24 + 1;
      iVar3 = ss_ilg((saidx_t)((long)local_1b8 - (long)local_18 >> 2));
      depth_00 = iVar7;
    }
  } while( true );
}

Assistant:

static
void
ss_mintrosort(const sauchar_t *T, const saidx_t *PA,
              saidx_t *first, saidx_t *last,
              saidx_t depth) {
#define STACK_SIZE SS_MISORT_STACKSIZE
  struct { saidx_t *a, *b, c; saint_t d; } stack[STACK_SIZE];
  const sauchar_t *Td;
  saidx_t *a, *b, *c, *d, *e, *f;
  saidx_t s, t;
  saint_t ssize;
  saint_t limit;
  saint_t v, x = 0;

  for(ssize = 0, limit = ss_ilg(last - first);;) {

    if((last - first) <= SS_INSERTIONSORT_THRESHOLD) {
#if 1 < SS_INSERTIONSORT_THRESHOLD
      if(1 < (last - first)) { ss_insertionsort(T, PA, first, last, depth); }
#endif
      STACK_POP(first, last, depth, limit);
      continue;
    }

    Td = T + depth;
    if(limit-- == 0) { ss_heapsort(Td, PA, first, last - first); }
    if(limit < 0) {
      for(a = first + 1, v = Td[PA[*first]]; a < last; ++a) {
        if((x = Td[PA[*a]]) != v) {
          if(1 < (a - first)) { break; }
          v = x;
          first = a;
        }
      }
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, a, depth);
      }
      if((a - first) <= (last - a)) {
        if(1 < (a - first)) {
          STACK_PUSH(a, last, depth, -1);
          last = a, depth += 1, limit = ss_ilg(a - first);
        } else {
          first = a, limit = -1;
        }
      } else {
        if(1 < (last - a)) {
          STACK_PUSH(first, a, depth + 1, ss_ilg(a - first));
          first = a, limit = -1;
        } else {
          last = a, depth += 1, limit = ss_ilg(a - first);
        }
      }
      continue;
    }

    /* choose pivot */
    a = ss_pivot(Td, PA, first, last);
    v = Td[PA[*a]];
    SWAP(*first, *a);

    /* partition */
    for(b = first; (++b < last) && ((x = Td[PA[*b]]) == v);) { }
    if(((a = b) < last) && (x < v)) {
      for(; (++b < last) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
    }
    for(c = last; (b < --c) && ((x = Td[PA[*c]]) == v);) { }
    if((b < (d = c)) && (x > v)) {
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }
    for(; b < c;) {
      SWAP(*b, *c);
      for(; (++b < c) && ((x = Td[PA[*b]]) <= v);) {
        if(x == v) { SWAP(*b, *a); ++a; }
      }
      for(; (b < --c) && ((x = Td[PA[*c]]) >= v);) {
        if(x == v) { SWAP(*c, *d); --d; }
      }
    }

    if(a <= d) {
      c = b - 1;

      if((s = a - first) > (t = b - a)) { s = t; }
      for(e = first, f = b - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }
      if((s = d - c) > (t = last - d - 1)) { s = t; }
      for(e = b, f = last - s; 0 < s; --s, ++e, ++f) { SWAP(*e, *f); }

      a = first + (b - a), c = last - (d - c);
      b = (v <= Td[PA[*a] - 1]) ? a : ss_partition(PA, a, c, depth);

      if((a - first) <= (last - c)) {
        if((last - c) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(c, last, depth, limit);
          last = a;
        } else if((a - first) <= (c - b)) {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          last = a;
        } else {
          STACK_PUSH(c, last, depth, limit);
          STACK_PUSH(first, a, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      } else {
        if((a - first) <= (c - b)) {
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          STACK_PUSH(first, a, depth, limit);
          first = c;
        } else if((last - c) <= (c - b)) {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(b, c, depth + 1, ss_ilg(c - b));
          first = c;
        } else {
          STACK_PUSH(first, a, depth, limit);
          STACK_PUSH(c, last, depth, limit);
          first = b, last = c, depth += 1, limit = ss_ilg(c - b);
        }
      }
    } else {
      limit += 1;
      if(Td[PA[*first] - 1] < v) {
        first = ss_partition(PA, first, last, depth);
        limit = ss_ilg(last - first);
      }
      depth += 1;
    }
  }
#undef STACK_SIZE
}